

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml_load_mmap.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *contents;
  size_t size;
  rep rVar1;
  ostream *this;
  duration<long,_std::ratio<1L,_1000000000L>_> local_148;
  duration<long,_std::ratio<1L,_1000L>_> local_140;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_138;
  time_point end;
  xml_parse_result result;
  time_point start;
  undefined1 local_100 [8];
  xml_document doc;
  MemoryInput input;
  char **argv_local;
  int argc_local;
  
  if (1 < argc) {
    MemoryInput::MemoryInput((MemoryInput *)(doc._memory + 0xb8),argv[1]);
    pugi::xml_document::xml_document((xml_document *)local_100);
    result._16_8_ = std::chrono::_V2::system_clock::now();
    contents = MemoryInput::buffer((MemoryInput *)(doc._memory + 0xb8));
    size = MemoryInput::size((MemoryInput *)(doc._memory + 0xb8));
    pugi::xml_document::load_buffer
              ((xml_parse_result *)&end,(xml_document *)local_100,contents,size,0x74,encoding_auto);
    local_138.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_148.__r =
         (rep)std::chrono::operator-
                        (&local_138,
                         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&result.encoding);
    local_140.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        (&local_148);
    rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_140);
    this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar1);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    pugi::xml_document::~xml_document((xml_document *)local_100);
    MemoryInput::~MemoryInput((MemoryInput *)(doc._memory + 0xb8));
  }
  return 0;
}

Assistant:

int main(int argc, const char *argv[])
{
    if (argc < 2) return 0;
    MemoryInput input(argv[1]);

    pugi::xml_document doc;

    using namespace std::chrono;

    auto start = high_resolution_clock::now();

    pugi::xml_parse_result result = doc.load_buffer(input.buffer(), input.size());

    auto end = high_resolution_clock::now();;

    std::cout << duration_cast<milliseconds>(end - start).count() << std::endl;
}